

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void luaS_init(lua_State *L)

{
  global_State *pgVar1;
  TString *pTVar2;
  long lVar3;
  long lVar4;
  TString *(*papTVar5) [2];
  
  pgVar1 = L->l_G;
  luaS_resize(L,0x80);
  pTVar2 = luaS_newlstr(L,"not enough memory",0x11);
  pgVar1->memerrmsg = pTVar2;
  luaC_fix(L,(GCObject *)pTVar2);
  pTVar2 = pgVar1->memerrmsg;
  papTVar5 = pgVar1->strcache;
  for (lVar3 = 0; lVar3 != 0x35; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      (*papTVar5)[lVar4] = pTVar2;
    }
    papTVar5 = papTVar5 + 1;
  }
  return;
}

Assistant:

void luaS_init(lua_State *L) {
    global_State *g = G(L);
    int i, j;
    luaS_resize(L, MINSTRTABSIZE);  /* initial size of string table */
    /* pre-create memory-error message */
    g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
    luaC_fix(L, obj2gco(g->memerrmsg));  /* it should never be collected */
    for (i = 0; i < STRCACHE_N; i++)  /* fill cache with valid strings */
        for (j = 0; j < STRCACHE_M; j++)
            g->strcache[i][j] = g->memerrmsg;
}